

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O3

bool StringEq(string *a,string *b,char *filename,int lineno,char *namea,char *nameb)

{
  size_t __n;
  int iVar1;
  
  __n = a->_M_string_length;
  if (__n == b->_M_string_length) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  printf("%s: %d: ASSERT FAILED: %s == %s:\n",filename,(ulong)(uint)lineno,namea,nameb);
  printf("EXPECTED:\n%s\n",(a->_M_dataplus)._M_p);
  printf("ACTUAL:\n%s\n",(b->_M_dataplus)._M_p);
  return false;
}

Assistant:

bool StringEq(const string& a, const string& b,
                    const char* filename, int lineno,
                    const char* namea, const char* nameb) {
  if (a != b) {
    printf("%s: %d: ASSERT FAILED: %s == %s:\n", filename, lineno,
           namea, nameb);
    printf("EXPECTED:\n%s\n", a.c_str());
    printf("ACTUAL:\n%s\n", b.c_str());
    return false;
  }
  return true;
}